

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O0

TestMutualRecursionA_SubGroup * __thiscall
proto2_unittest::TestMutualRecursionA::_internal_mutable_subgroup(TestMutualRecursionA *this)

{
  Arena *arena;
  TestMutualRecursionA_SubGroup *pTVar1;
  TestMutualRecursionA_SubGroup *p;
  TestMutualRecursionA *this_local;
  
  if ((this->field_0)._impl_.subgroup_ == (TestMutualRecursionA_SubGroup *)0x0) {
    arena = google::protobuf::MessageLite::GetArena((MessageLite *)this);
    pTVar1 = (TestMutualRecursionA_SubGroup *)
             google::protobuf::Arena::
             DefaultConstruct<proto2_unittest::TestMutualRecursionA_SubGroup>(arena);
    (this->field_0)._impl_.subgroup_ = pTVar1;
  }
  return (this->field_0)._impl_.subgroup_;
}

Assistant:

inline ::proto2_unittest::TestMutualRecursionA_SubGroup* PROTOBUF_NONNULL TestMutualRecursionA::_internal_mutable_subgroup() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.subgroup_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::proto2_unittest::TestMutualRecursionA_SubGroup>(GetArena());
    _impl_.subgroup_ = reinterpret_cast<::proto2_unittest::TestMutualRecursionA_SubGroup*>(p);
  }
  return _impl_.subgroup_;
}